

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O0

int Fxch_DivRemoveLits(Vec_Int_t *vCube0,Vec_Int_t *vCube1,Vec_Int_t *vDiv,int *fCompl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool local_c1;
  bool local_a5;
  int Lit3;
  int Lit2;
  int Lit1;
  int Lit0;
  int ret;
  int Count;
  int CountN;
  int CountP;
  int Lit;
  int i;
  int *fCompl_local;
  Vec_Int_t *vDiv_local;
  Vec_Int_t *vCube1_local;
  Vec_Int_t *vCube0_local;
  
  Count = 0;
  ret = 0;
  Lit0 = 0;
  for (CountP = 0; iVar1 = Vec_IntSize(vDiv), CountP < iVar1; CountP = CountP + 1) {
    iVar1 = Vec_IntEntry(vDiv,CountP);
    iVar2 = Abc_Lit2Var(iVar1);
    iVar2 = Abc_LitIsCompl(iVar2);
    if (iVar2 == 0) {
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = Vec_IntRemove1(vCube0,iVar1);
      Count = iVar1 + Count;
    }
    else {
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = Vec_IntRemove1(vCube0,iVar1);
      ret = iVar1 + ret;
    }
  }
  for (CountP = 0; iVar1 = Vec_IntSize(vDiv), CountP < iVar1; CountP = CountP + 1) {
    iVar1 = Vec_IntEntry(vDiv,CountP);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Vec_IntRemove1(vCube1,iVar1);
    Lit0 = iVar1 + Lit0;
  }
  iVar1 = Vec_IntSize(vDiv);
  if (iVar1 == 2) {
    for (CountP = 0; iVar1 = Vec_IntSize(vDiv), CountP < iVar1; CountP = CountP + 1) {
      iVar1 = Vec_IntEntry(vDiv,CountP);
      iVar2 = Abc_Lit2Var(iVar1);
      iVar2 = Abc_LitNot(iVar2);
      Vec_IntRemove1(vCube0,iVar2);
      iVar1 = Abc_Lit2Var(iVar1);
      iVar1 = Abc_LitNot(iVar1);
      Vec_IntRemove1(vCube1,iVar1);
    }
  }
  Lit1 = Lit0 + Count + ret;
  iVar1 = Vec_IntSize(vDiv);
  if (iVar1 == 4) {
    iVar1 = Vec_IntEntry(vDiv,0);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar2 = Vec_IntEntry(vDiv,1);
    iVar2 = Abc_Lit2Var(iVar2);
    iVar3 = Vec_IntEntry(vDiv,2);
    iVar3 = Abc_Lit2Var(iVar3);
    iVar4 = Vec_IntEntry(vDiv,3);
    iVar4 = Abc_Lit2Var(iVar4);
    iVar5 = Abc_LitNot(iVar2);
    if (((iVar1 == iVar5) && (iVar4 = Abc_LitNot(iVar4), iVar3 == iVar4)) && (ret == 1)) {
      *fCompl = 1;
    }
    iVar2 = Abc_LitNot(iVar2);
    if ((iVar1 == iVar2) && (Lit1 == 2)) {
      *fCompl = 1;
      for (CountP = 0; iVar1 = Vec_IntSize(vDiv), CountP < iVar1; CountP = CountP + 1) {
        iVar1 = Vec_IntEntry(vDiv,CountP);
        uVar6 = Abc_Lit2Var(iVar1);
        local_a5 = fCompl != (int *)0x0 && 1 < CountP;
        iVar1 = Vec_IntRemove1(vCube0,uVar6 ^ local_a5);
        Lit1 = iVar1 + Lit1;
      }
      for (CountP = 0; iVar1 = Vec_IntSize(vDiv), CountP < iVar1; CountP = CountP + 1) {
        iVar1 = Vec_IntEntry(vDiv,CountP);
        uVar6 = Abc_Lit2Var(iVar1);
        local_c1 = fCompl != (int *)0x0 && 1 < CountP;
        iVar1 = Vec_IntRemove1(vCube1,uVar6 ^ local_c1);
        Lit1 = iVar1 + Lit1;
      }
    }
  }
  return Lit1;
}

Assistant:

int Fxch_DivRemoveLits( Vec_Int_t* vCube0,
                        Vec_Int_t* vCube1,
                        Vec_Int_t* vDiv,
                        int *fCompl )
{
    int i,
        Lit,
        CountP = 0,
        CountN = 0,
        Count = 0,
        ret = 0;

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Abc_Lit2Var( Lit ) ) )
            CountN += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );
        else
            CountP += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        Count += Vec_IntRemove1( vCube1, Abc_Lit2Var( Lit ) );

   if ( Vec_IntSize( vDiv ) == 2 )
       Vec_IntForEachEntry( vDiv, Lit, i )
       {
           Vec_IntRemove1( vCube0, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
           Vec_IntRemove1( vCube1, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
       }

    ret = Count + CountP + CountN;

    if ( Vec_IntSize( vDiv ) == 4 )
    {
        int Lit0 = Abc_Lit2Var( Vec_IntEntry( vDiv, 0 ) ),
            Lit1 = Abc_Lit2Var( Vec_IntEntry( vDiv, 1 ) ),
            Lit2 = Abc_Lit2Var( Vec_IntEntry( vDiv, 2 ) ),
            Lit3 = Abc_Lit2Var( Vec_IntEntry( vDiv, 3 ) );

        if ( Lit0 == Abc_LitNot( Lit1 ) && Lit2 == Abc_LitNot( Lit3 ) && CountN == 1 )
            *fCompl = 1;

        if ( Lit0 == Abc_LitNot( Lit1 ) && ret == 2 )
        {
            *fCompl = 1;

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube0, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube1, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );
        }
    }

    return ret;
}